

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

TextureData __thiscall QRhiWidgetPrivate::texture(QRhiWidgetPrivate *this)

{
  QRhiTexture *pQVar1;
  TextureData TVar2;
  
  qDeleteAll<QList<QRhiResource*>>(&this->pendingDeletes);
  QList<QRhiResource_*>::clear(&this->pendingDeletes);
  pQVar1 = this->resolveTexture;
  if (pQVar1 == (QRhiTexture *)0x0) {
    pQVar1 = this->colorTexture;
  }
  if (this->textureInvalid != false) {
    pQVar1 = (QRhiTexture *)0x0;
  }
  TVar2.textureRight = (QRhiTexture *)0x0;
  TVar2.textureLeft = pQVar1;
  return TVar2;
}

Assistant:

QWidgetPrivate::TextureData QRhiWidgetPrivate::texture() const
{
    // This is the only safe place to clear pendingDeletes, due to the
    // possibility of the texture returned in the previous invocation of this
    // function having been added to pendingDeletes, meaning the object then
    // needs to be valid until the next (this) invocation of this function.
    // (the exact object lifetime requirements depend on the
    // QWidget/RepaintManager internal implementation; for now avoid relying on
    // such details by clearing pendingDeletes only here, not in endCompose())
    qDeleteAll(pendingDeletes);
    pendingDeletes.clear();

    TextureData td;
    if (!textureInvalid)
        td.textureLeft = resolveTexture ? resolveTexture : colorTexture;
    return td;
}